

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grib2dec.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long *plVar4;
  Output *pOVar5;
  undefined1 local_138 [4];
  G2DEC_Status status;
  G2DEC_Message message;
  int nbMessages;
  Output *output;
  Grib2Dec *decoder;
  undefined1 local_98 [8];
  Parameters params;
  char **argv_local;
  int argc_local;
  
  params.filter.lonMax = (double)argv;
  Parameters::Parameters((Parameters *)local_98);
  if (argc < 2) {
    usage();
    argv_local._4_4_ = -1;
  }
  else {
    bVar1 = parseArguments(argc,(char **)params.filter.lonMax,(Parameters *)local_98);
    if (bVar1) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      plVar4 = (long *)grib2dec::Grib2Dec::create(pcVar3);
      if (plVar4 == (long *)0x0) {
        argv_local._4_4_ = -1;
      }
      else {
        (**(code **)(*plVar4 + 8))(plVar4,(undefined1 *)((long)&params.outputFormat.field_2 + 8));
        pOVar5 = grib2dec_demo::Output::create
                           ((string *)((long)&params.inputFile.field_2 + 8),
                            (string *)((long)&params.outputFile.field_2 + 8));
        message._116_4_ = 0;
        while (iVar2 = (**(code **)*plVar4)(plVar4,local_138), iVar2 != 1) {
          if (iVar2 == 0) {
            if ((int)message.values !=
                message.grid.earthRadius._0_4_ * message.grid.earthRadius._4_4_) {
              __assert_fail("message.valuesLength == message.grid.ni * message.grid.nj",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/LouJo[P]grib2dec/apps/grib2dec.cpp"
                            ,0x6b,"int main(int, char **)");
            }
            (**pOVar5->_vptr_Output)(pOVar5,local_138);
            message._116_4_ = message._116_4_ + 1;
          }
        }
        (*pOVar5->_vptr_Output[1])();
        if (pOVar5 != (Output *)0x0) {
          (*pOVar5->_vptr_Output[3])();
        }
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 0x18))();
        }
        argv_local._4_4_ = 0;
      }
    }
    else {
      argv_local._4_4_ = -1;
    }
  }
  Parameters::~Parameters((Parameters *)local_98);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    Parameters params;

    if (argc < 2)
        return usage(), -1;

    if (!parseArguments(argc, argv, params))
        return -1;

    grib2dec::Grib2Dec *decoder =
            grib2dec::Grib2Dec::create(params.inputFile.c_str());

    if (!decoder)
        return -1;

    decoder->setSpatialFilter(params.filter);

    Output *output = Output::create(params.outputFile, params.outputFormat);

    int nbMessages = 0;

    while (true) {
        G2DEC_Message message;
        auto status = decoder->nextMessage(message);
        if (status == G2DEC_STATUS_END)
            break;
        else if (status == G2DEC_STATUS_OK) {
            assert(message.valuesLength == message.grid.ni * message.grid.nj);
            output->setComponent(message);
            nbMessages++;
        }
    }

    output->end();

    delete output;
    delete decoder;

    return 0;
}